

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O0

void __thiscall tiles::Wire::flip(Wire *this,Chunk *chunk,uint tileIndex,bool acrossVertical)

{
  byte bVar1;
  TileData *pTVar2;
  byte in_CL;
  TileData *tileData;
  Chunk *in_stack_ffffffffffffffd8;
  TileType *in_stack_ffffffffffffffe0;
  
  bVar1 = in_CL & 1;
  pTVar2 = TileType::modifyTileData(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0);
  if (((uint)*pTVar2 & 0x1f) == 2) {
    if (bVar1 == 0) {
      if (((uint)*pTVar2 >> 0xc & 3) % 2 == 0) {
        *pTVar2 = (TileData)
                  ((uint)*pTVar2 & 0xffffcfff | (((uint)*pTVar2 >> 0xc & 3) + 1 & 3) << 0xc);
      }
      else {
        *pTVar2 = (TileData)
                  ((uint)*pTVar2 & 0xffffcfff | (((uint)*pTVar2 >> 0xc & 3) - 1 & 3) << 0xc);
      }
    }
    else {
      *pTVar2 = (TileData)((uint)*pTVar2 & 0xffffcfff | (3 - ((uint)*pTVar2 >> 0xc & 3) & 3) << 0xc)
      ;
    }
  }
  else if ((((uint)*pTVar2 & 0x1f) == 3) &&
          (((bVar1 != 0 && (((uint)*pTVar2 >> 0xc & 3) % 2 == 0)) ||
           ((bVar1 == 0 && (((uint)*pTVar2 >> 0xc & 3) % 2 == 1)))))) {
    *pTVar2 = (TileData)
              ((uint)*pTVar2 & 0xffffcfff |
              (uint)(byte)((ulong)(((uint)*pTVar2 >> 0xc & 3) + 2) % 4) << 0xc);
  }
  return;
}

Assistant:

void Wire::flip(Chunk& chunk, unsigned int tileIndex, bool acrossVertical) {
    auto& tileData = modifyTileData(chunk, tileIndex);
    if (tileData.id == TileId::wireCorner) {
        if (acrossVertical) {
            tileData.dir = static_cast<Direction::t>(3 - tileData.dir);
        } else if (tileData.dir % 2 == 0) {
            tileData.dir = static_cast<Direction::t>(tileData.dir + 1);
        } else {
            tileData.dir = static_cast<Direction::t>(tileData.dir - 1);
        }
    } else if (tileData.id == TileId::wireTee && ((acrossVertical && tileData.dir % 2 == 0) || (!acrossVertical && tileData.dir % 2 == 1))) {
        tileData.dir = static_cast<Direction::t>((tileData.dir + 2) % 4);
    }
}